

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void __thiscall
OpenSteer::DrawSphereHelper::drawTriangleOnSphere(DrawSphereHelper *this,Vec3 *a,Vec3 *b,Vec3 *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  Vec3 *c_00;
  Color *pCVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  
  fVar13 = (a->z + b->z + c->z) / 3.0;
  uVar1 = a->x;
  uVar5 = a->y;
  uVar2 = b->x;
  uVar6 = b->y;
  uVar3 = c->x;
  uVar7 = c->y;
  auVar15._0_4_ = (float)uVar3 + (float)uVar2 + (float)uVar1;
  auVar15._4_4_ = (float)uVar7 + (float)uVar6 + (float)uVar5;
  auVar15._8_8_ = 0;
  auVar15 = divps(auVar15,_DAT_00147200);
  uVar4 = (this->center).x;
  uVar8 = (this->center).y;
  fVar16 = auVar15._0_4_ - (float)uVar4;
  fVar18 = auVar15._4_4_ - (float)uVar8;
  auVar17._0_8_ = CONCAT44(fVar18,fVar16);
  auVar17._8_4_ = auVar15._8_4_ - 0.0;
  auVar17._12_4_ = auVar15._12_4_ - 0.0;
  fVar20 = fVar13 - (this->center).z;
  fVar14 = auVar15._4_4_ - (this->viewpoint).y;
  fVar13 = fVar13 - (this->viewpoint).z;
  fVar19 = auVar15._0_4_ - (this->viewpoint).x;
  uVar9._0_1_ = this->drawFrontFacing;
  uVar9._1_1_ = this->drawBackFacing;
  uVar9._2_2_ = *(undefined2 *)&this->field_0x2a;
  uVar11 = uVar9;
  if (0.0 < fVar13 * fVar20 + fVar19 * fVar16 + fVar18 * fVar14) {
    uVar11 = (uint)this->drawBackFacing;
  }
  if ((uVar11 & 1) == 0) {
    return;
  }
  if (this->filled == true) {
    c_00 = c;
    if ((uVar9 & 1) != 0) {
      c_00 = a;
      a = c;
    }
    drawTriangle(a,b,c_00,&this->color);
    return;
  }
  fVar16 = SQRT(fVar20 * fVar20 + fVar16 * fVar16 + fVar18 * fVar18);
  if (0.0 < fVar16) {
    auVar10._4_4_ = fVar16;
    auVar10._0_4_ = fVar16;
    auVar10._8_4_ = fVar16;
    auVar10._12_4_ = fVar16;
    auVar15 = divps(auVar17,auVar10);
    auVar17._0_8_ = auVar15._0_8_;
  }
  if ((-0.05 < ABS(fVar13 * (float)(~-(uint)(0.0 < fVar16) & (uint)fVar20 |
                                   (uint)(fVar20 / fVar16) & -(uint)(0.0 < fVar16)) +
                   fVar14 * (float)((ulong)auVar17._0_8_ >> 0x20) + fVar19 * (float)auVar17._0_8_))
     && (((this->drawBackFacing & 1U) == 0 || ((uVar9 & 1) == 0)))) {
    pCVar12 = &this->color;
    drawLine(a,b,pCVar12);
    drawLine(b,c,pCVar12);
    drawLine(c,a,pCVar12);
    return;
  }
  pCVar12 = &this->color;
  drawMeshedTriangleLine(this,a,b,pCVar12);
  drawMeshedTriangleLine(this,b,c,pCVar12);
  drawMeshedTriangleLine(this,c,a,pCVar12);
  return;
}

Assistant:

void drawTriangleOnSphere (const Vec3& a, 
                                   const Vec3& b,
                                   const Vec3& c) const
        {
            // draw triangle, subject to the camera orientation criteria
            // (according to drawBackFacing and drawFrontFacing)
            const Vec3 triCenter = (a + b + c) / 3.0f;
            const Vec3 triNormal = triCenter - center; // not unit length
            const Vec3 view = triCenter - viewpoint;
            const float dot = view.dot (triNormal); // project normal on view
            const bool seen = ((dot>0.0f) ? drawBackFacing : drawFrontFacing);
            if (seen)
            {
                if (filled)
                {
                    // draw filled triangle
                    if (drawFrontFacing)
                        drawTriangle (c, b, a, color);
                    else
                        drawTriangle (a, b, c, color);
                }
                else
                {
                    // draw triangle edges (use trick to avoid drawing each
                    // edge twice (for each adjacent triangle) unless we are
                    // culling and this tri is near the sphere's silhouette)
                    const float unitDot = view.dot (triNormal.normalize ());
                    const float t = 0.05f; // near threshold
                    const bool nearSilhouette = (unitDot<t) || (unitDot>-t);
                    if (nearSilhouette && !(drawBackFacing&&drawFrontFacing))
                    {
                        drawLine (a, b, color);
                        drawLine (b, c, color);
                        drawLine (c, a, color);
                    }
                    else
                    {
                        drawMeshedTriangleLine (a, b, color);
                        drawMeshedTriangleLine (b, c, color);
                        drawMeshedTriangleLine (c, a, color);
                    }
                }
            }
        }